

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

errr finish_parse_p_race(parser *p)

{
  player_race *ppVar1;
  int local_1c;
  player_race *ppStack_18;
  wchar_t num;
  player_race *r;
  parser *p_local;
  
  local_1c = 0;
  races = (player_race *)parser_priv(p);
  for (ppStack_18 = races; ppVar1 = races, ppStack_18 != (player_race *)0x0;
      ppStack_18 = ppStack_18->next) {
    local_1c = local_1c + 1;
  }
  while( true ) {
    ppStack_18 = ppVar1;
    if (ppStack_18 == (player_race *)0x0) {
      parser_destroy(p);
      return 0;
    }
    if (local_1c == 0) break;
    ppStack_18->ridx = local_1c - 1;
    local_1c = local_1c + -1;
    ppVar1 = ppStack_18->next;
  }
  __assert_fail("num",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c",
                0xb0b,"errr finish_parse_p_race(struct parser *)");
}

Assistant:

static errr finish_parse_p_race(struct parser *p) {
	struct player_race *r;
	int num = 0;
	races = parser_priv(p);
	for (r = races; r; r = r->next) num++;
	for (r = races; r; r = r->next, num--) {
		assert(num);
		r->ridx = num - 1;
	}
	parser_destroy(p);
	return 0;
}